

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O0

void __thiscall httpproxy::httpproxy(httpproxy *this,naiveconfig *cfg)

{
  naiveconfig *cfg_local;
  httpproxy *this_local;
  
  tcpproxy::tcpproxy(&this->super_tcpproxy,cfg);
  (this->super_tcpproxy).super_proxy._vptr_proxy = (_func_int **)&PTR__httpproxy_00118ca8;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            (&this->clientfds);
  return;
}

Assistant:

httpproxy(naiveconfig *cfg) : tcpproxy(cfg){}